

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O3

void CServerBrowser::CBFTrackPacket(int TrackID,void *pCallbackUser)

{
  int64 iVar1;
  long lVar2;
  
  if (pCallbackUser != (void *)0x0) {
    for (lVar2 = *(long *)((long)pCallbackUser + 0xce38); lVar2 != 0;
        lVar2 = *(long *)(lVar2 + 0x22c8)) {
      if (*(int *)(lVar2 + 0x28) == TrackID) {
        iVar1 = time_get();
        *(int64 *)(lVar2 + 0x18) = iVar1;
        return;
      }
    }
  }
  return;
}

Assistant:

void CServerBrowser::CBFTrackPacket(int TrackID, void *pCallbackUser)
{
	if(!pCallbackUser)
		return;

	CServerBrowser *pSelf = (CServerBrowser *)pCallbackUser;
	CServerEntry *pEntry = pSelf->m_pFirstReqServer;
	while(1)
	{
		if(!pEntry)	// no more entries
			break;

		if(pEntry->m_TrackID == TrackID)	// got it -> update
		{
			pEntry->m_RequestTime = time_get();
			break;
		}

		pEntry = pEntry->m_pNextReq;
	}
}